

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O0

int skipheader(_func_int_void_ptr *getin,void *in)

{
  uint uVar1;
  int i;
  void *in_local;
  _func_int_void_ptr *getin_local;
  
  do {
    uVar1 = (*getin)(in);
    if ((int)uVar1 < 0) {
      return -1;
    }
  } while ((uVar1 & 0x80) != 0);
  return 0;
}

Assistant:

int skipheader(int (*getin)(void *in), void *in)
{
	int i;

	do {
		i = getin(in);
		if(i < 0) {
			return (-1);
		}
	} while(i & 0x80);

	return 0;
}